

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

BOOL fetch_next_token(Token *t)

{
  BOOL BVar1;
  undefined1 local_58 [8];
  Token temp2;
  Token temp;
  Token *t_local;
  
  if (fetch_next_token::saved_token.type == TOK_EMPTY) {
    BVar1 = raw_fetch_next_token(t);
    if (BVar1 == FALSE) {
      t_local._4_4_ = FALSE;
    }
    else if (t->type == TOK_LEFT_PAREN) {
      BVar1 = raw_fetch_next_token(&fetch_next_token::saved_token);
      if (BVar1 == FALSE) {
        t_local._4_4_ = TRUE;
      }
      else if (fetch_next_token::saved_token.type == TOK_INCLUDE) {
        fetch_next_token::saved_token.type = TOK_EMPTY;
        BVar1 = raw_fetch_next_token((Token *)&temp2.lineno);
        if (BVar1 == FALSE) {
          fatal_input_error("include directive is missing filename!\n");
        }
        if ((int)temp2.lineno != 0x1c) {
          if ((int)temp2.lineno != 0x1b) {
            fatal_input_error("Filename for include must be in \"\" quotes.\n");
          }
          input_error("Filename for include must be in \"\" quotes.\n");
        }
        raw_fetch_next_token((Token *)local_58);
        if (local_58._0_4_ != TOK_RIGHT_PAREN) {
          fatal_input_error("Too many arguments to include directive.\n");
        }
        open_file((char *)temp._0_8_,include_dirs);
        t_local._4_4_ = fetch_next_token(t);
      }
      else {
        t_local._4_4_ = TRUE;
      }
    }
    else {
      t_local._4_4_ = TRUE;
    }
  }
  else {
    *(ulong *)t = CONCAT44(fetch_next_token::saved_token._4_4_,fetch_next_token::saved_token.type);
    t->u = fetch_next_token::saved_token.u;
    t->filename = fetch_next_token::saved_token.filename;
    t->lineno = fetch_next_token::saved_token.lineno;
    fetch_next_token::saved_token.type = TOK_EMPTY;
    t_local._4_4_ = TRUE;
  }
  return t_local._4_4_;
}

Assistant:

BOOL
fetch_next_token (Token *t)
{
  static Token saved_token = { TOK_EMPTY };
  Token temp, temp2;

  if (saved_token.type != TOK_EMPTY)
    {
      *t = saved_token;
      saved_token.type = TOK_EMPTY;
      return YES;
    }

  /* Read in the next token.  If it's not an open paren, pass it on. */
  if (!raw_fetch_next_token (t))
    return NO;
  if (t->type != TOK_LEFT_PAREN)
    return YES;

  /* Check to see if this is an #include directive. */
  if (!raw_fetch_next_token (&saved_token))
    return YES;

  if (saved_token.type != TOK_INCLUDE)
    return YES;
  saved_token.type = TOK_EMPTY;
  
  if (!raw_fetch_next_token (&temp))
    {
      fatal_input_error ("include directive is missing filename!\n");
    }
  
  if (temp.type != TOK_QUOTED_STRING)
    {
      /* Punt unless it's an identifier; if it is, include the file anyway. */
      if (temp.type != TOK_IDENTIFIER)
	{
	  fatal_input_error ("Filename for include must be in \"\" quotes.\n");
	}
      input_error ("Filename for include must be in \"\" quotes.\n");
    }

  raw_fetch_next_token (&temp2);  /* Eat the close paren. */
  if (temp2.type != TOK_RIGHT_PAREN)
    {
      fatal_input_error ("Too many arguments to include directive.\n");
    }
  open_file (temp.u.string, include_dirs);
  return fetch_next_token (t);
}